

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O0

bool __thiscall cppjieba::HMMModel::GetLine(HMMModel *this,ifstream *ifile,string *line)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  string *in_RDX;
  istream *in_RSI;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  string *str;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  istream *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  do {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_18,local_20);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) {
        return false;
      }
      limonp::Trim((string *)0x15e1d4);
      uVar3 = std::__cxx11::string::empty();
    } while ((uVar3 & 1) != 0);
    str = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"#",&local_41);
    in_stack_ffffffffffffff97 =
         limonp::StartsWith((string *)str,
                            (string *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
    ;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  } while ((in_stack_ffffffffffffff97 & 1) != 0);
  return true;
}

Assistant:

bool GetLine(ifstream& ifile, string& line) {
    while (getline(ifile, line)) {
      Trim(line);
      if (line.empty()) {
        continue;
      }
      if (StartsWith(line, "#")) {
        continue;
      }
      return true;
    }
    return false;
  }